

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  string_view value;
  string_view value_00;
  _func_int ***ppp_Var1;
  execution_context eVar2;
  undefined8 uVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ostream *poVar5;
  long *plVar6;
  int *piVar7;
  service *psVar8;
  long *plVar9;
  string_view bucket;
  string_view command;
  string_view bucket_00;
  string_view bucket_01;
  string_view bucket_02;
  string_view bucket_03;
  string_view bucket_04;
  string_view key;
  string_view payload;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar10;
  shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  sVar11;
  io_service service;
  NotifyToken<int> tok;
  NotifyToken<int> tok_1;
  MiniBusClient client;
  shared_ptr<mini_bus::ConnectionInfo> local_16b8;
  io_context local_16a8;
  undefined1 local_1698 [16];
  undefined1 local_1688 [16];
  undefined1 local_1678 [32];
  condition_variable local_1658 [64];
  undefined1 local_1618 [136];
  char *pcStack_1590;
  undefined8 local_1588;
  char *pcStack_1580;
  undefined8 local_1558 [2];
  code *local_1548;
  code *local_1540;
  _Any_data local_1538;
  code *local_1528;
  code *local_1520;
  undefined8 local_1518 [2];
  undefined8 local_1508 [3];
  MiniBusClient local_14f0;
  
  boost::asio::io_context::io_context(&local_16a8);
  boost::asio::ip::make_address((address *)&local_14f0,"127.0.0.1");
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)local_1688,(address *)&local_14f0,0xfc8);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011f8e0;
  local_16b8.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this + 1);
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BasicConnectionInfo_0011f930;
  *(io_context **)&this[1]._M_use_count = &local_16a8;
  this[2]._vptr__Sp_counted_base = (_func_int **)local_1688._0_8_;
  this[2]._M_use_count = local_1688._8_4_;
  this[2]._M_weak_count = local_1688._12_4_;
  *(ulong *)&this[2]._M_weak_count = CONCAT44(local_1678._0_4_,local_1688._12_4_);
  *(ulong *)((long)&this[3]._vptr__Sp_counted_base + 4) =
       CONCAT44(local_1678._8_4_,local_1678._4_4_);
  this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[4]._M_use_count = 0;
  this[4]._M_weak_count = 0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = 2;
  }
  local_16b8.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this;
  mini_bus::MiniBusClient::MiniBusClient(&local_14f0,&local_16b8);
  if (local_16b8.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_16b8.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (**(code **)(*this[4]._vptr__Sp_counted_base + 0x10))();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"connected",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  local_1538._M_unused._M_object = (void *)0x0;
  local_1538._8_8_ = 0;
  local_1520 = std::
               _Function_handler<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo.cpp:17:37)>
               ::_M_invoke;
  local_1528 = std::
               _Function_handler<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo.cpp:17:37)>
               ::_M_manager;
  bucket._M_str = "shared";
  bucket._M_len = 6;
  key._M_str = "key";
  key._M_len = 3;
  mini_bus::MiniBusClient::observe
            (&local_14f0,bucket,key,
             (function<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>)>
              *)&local_1538);
  if (local_1528 != (code *)0x0) {
    (*local_1528)(&local_1538,&local_1538,3);
  }
  local_1688._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1678;
  std::__cxx11::string::_M_construct((ulong)local_1688,'\0');
  uVar3 = local_1688._0_8_;
  plVar9 = (long *)CONCAT44(local_1688._12_4_,local_1688._8_4_);
  command._M_str = (char *)0x4;
  command._M_len = (size_t)&local_14f0;
  payload._M_str = (char *)plVar9;
  payload._M_len = (size_t)"PING";
  mini_bus::MiniBusClient::send_simple_abi_cxx11_((MiniBusClient *)local_1618,command,payload);
  local_1698._8_8_ = uVar3;
  local_1698._0_8_ = plVar9;
  mini_bus::
  operator>><std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_codehz[P]mini_bus_cpp_include_mini_bus_hpp:499:44)>
            ((mini_bus *)(local_1618 + 0x70),
             (shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1618,(anon_class_16_1_5476146e_for_func *)local_1698);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._8_8_);
  }
  (**(code **)(*(long *)local_1618._112_8_ + 0x10))();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._120_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._120_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1688._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1678) {
    operator_delete((void *)local_1688._0_8_,CONCAT44(local_1678._4_4_,local_1678._0_4_) + 1);
  }
  local_1588 = 5;
  pcStack_1580 = "value";
  value._M_str = "value";
  value._M_len = 5;
  bucket_00._M_str = (char *)0x6;
  bucket_00._M_len = (size_t)&local_14f0;
  key_00._M_str = (char *)0x3;
  key_00._M_len = (size_t)"shared";
  mini_bus::MiniBusClient::set((MiniBusClient *)local_1688,bucket_00,key_00,value);
  (**(code **)(*(long *)local_1688._0_8_ + 0x10))();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_1688._12_4_,local_1688._8_4_)
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_1688._12_4_,local_1688._8_4_));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"v: ",3);
  bucket_01._M_str = (char *)0x6;
  bucket_01._M_len = (size_t)&local_14f0;
  key_01._M_str = (char *)0x3;
  key_01._M_len = (size_t)"shared";
  sVar10 = mini_bus::MiniBusClient::get_abi_cxx11_((MiniBusClient *)local_1618,bucket_01,key_01);
  (*(*(_func_int ***)local_1618._0_8_)[2])
            (local_1688,local_1618._0_8_,
             sVar10.
             super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._M_pi);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1688._0_8_,
                      CONCAT44(local_1688._12_4_,local_1688._8_4_));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((local_1678[0x10] == '\x01') &&
     (local_1678._16_8_ = local_1678._16_8_ & 0xffffffffffffff00,
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1688._0_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1678)) {
    operator_delete((void *)local_1688._0_8_,CONCAT44(local_1678._4_4_,local_1678._0_4_) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"here",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  bucket_02._M_str = (char *)0x6;
  bucket_02._M_len = (size_t)&local_14f0;
  sVar11 = mini_bus::MiniBusClient::keys_abi_cxx11_((MiniBusClient *)local_1618,bucket_02);
  (*(*(_func_int ***)local_1618._0_8_)[2])
            (local_1688,local_1618._0_8_,
             sVar11.
             super___shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._M_pi);
  plVar9 = (long *)local_1688;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._8_8_);
  }
  while (plVar9 = (long *)*plVar9, plVar9 != (long *)local_1688) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"kv: ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)plVar9[2],plVar9[3]);
    plVar6 = (long *)std::ostream::operator<<(poVar5,*(int *)(plVar9 + 6));
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
  }
  std::__cxx11::
  _List_base<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear((_List_base<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1688);
  local_1558[0] = 0;
  local_1558[1] = 0;
  local_1540 = std::
               _Function_handler<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo.cpp:29:36)>
               ::_M_invoke;
  local_1548 = std::
               _Function_handler<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo.cpp:29:36)>
               ::_M_manager;
  mini_bus::MiniBusClient::listen(&local_14f0,4,0x11506f);
  if (local_1548 != (code *)0x0) {
    (*local_1548)(local_1558,local_1558,3);
  }
  local_1688._0_8_ = &PTR__NotifyToken_0011f768;
  local_1688._8_4_ = 0;
  local_1688._12_4_ = 0;
  local_1678._0_4_ = 0;
  local_1678._4_4_ = 0;
  local_1678._8_4_ = 0;
  local_1678._12_4_ = 0;
  local_1678._16_8_ = (_func_result_type_void_ptr *)0x0;
  local_1678._24_8_ = 0;
  std::condition_variable::condition_variable(local_1658);
  local_1658[0x34] = (condition_variable)0x0;
  local_1658[0x38] = (condition_variable)0x0;
  local_1658[0x39] = (condition_variable)0x0;
  local_1658[0x3a] = (condition_variable)0x0;
  local_1658[0x3b] = (condition_variable)0x0;
  local_1658[0x3c] = (condition_variable)0x0;
  local_1658[0x3d] = (condition_variable)0x0;
  local_1658[0x3e] = (condition_variable)0x0;
  local_1658[0x3f] = (condition_variable)0x0;
  bucket_03._M_str = (char *)0x8;
  bucket_03._M_len = (size_t)&local_14f0;
  key_02._M_str = (char *)0x4;
  key_02._M_len = (size_t)"registry";
  sVar10 = mini_bus::MiniBusClient::get_abi_cxx11_((MiniBusClient *)local_1618,bucket_03,key_02);
  (*(*(_func_int ***)local_1618._0_8_)[2])
            (local_1518,local_1618._0_8_,
             sVar10.
             super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._M_pi);
  if (((undefined1)local_1508[2] == '\x01') &&
     (local_1508[2]._0_1_ = '\0', (undefined8 *)local_1518[0] != local_1508)) {
    operator_delete((void *)local_1518[0],local_1508[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1618._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"call",4);
  local_1618._128_8_ = 4;
  pcStack_1590 = "boom";
  value_00._M_str = "boom";
  value_00._M_len = 4;
  bucket_04._M_str = (char *)0x4;
  bucket_04._M_len = (size_t)&local_14f0;
  key_03._M_str = (char *)0x4;
  key_03._M_len = (size_t)"demo";
  sVar10 = mini_bus::MiniBusClient::call_abi_cxx11_
                     ((MiniBusClient *)local_1698,bucket_04,key_03,value_00);
  (**(code **)(*(long *)local_1698._0_8_ + 0x10))
            (local_1618,local_1698._0_8_,
             sVar10.
             super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._M_pi);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1618._0_8_,local_1618._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((local_1618[0x20] == '\x01') &&
     (local_1618[0x20] = '\0',
     (element_type *)local_1618._0_8_ != (element_type *)(local_1618 + 0x10))) {
    operator_delete((void *)local_1618._0_8_,(ulong)(local_1618._16_8_ + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1698._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1698._8_8_);
  }
  local_1618._0_8_ = (element_type *)0xa;
  local_1618._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    iVar4 = nanosleep((timespec *)local_1618,(timespec *)local_1618);
    if (iVar4 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  local_1688._0_8_ = &PTR__NotifyToken_0011f768;
  if (local_1658._56_8_ != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  std::condition_variable::~condition_variable(local_1658);
  mini_bus::MiniBusClient::~MiniBusClient(&local_14f0);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  for (psVar8 = (local_16a8.super_execution_context.service_registry_)->first_service_;
      eVar2.service_registry_ = local_16a8.super_execution_context.service_registry_,
      psVar8 != (service *)0x0; psVar8 = psVar8->next_) {
    (*psVar8->_vptr_service[2])(psVar8);
  }
  psVar8 = (local_16a8.super_execution_context.service_registry_)->first_service_;
  while (psVar8 != (service *)0x0) {
    ppp_Var1 = &psVar8->_vptr_service;
    psVar8 = psVar8->next_;
    (*(*ppp_Var1)[1])();
    (eVar2.service_registry_)->first_service_ = psVar8;
  }
  if (local_16a8.super_execution_context.service_registry_ != (service_registry *)0x0) {
    pthread_mutex_destroy
              ((pthread_mutex_t *)&(local_16a8.super_execution_context.service_registry_)->mutex_);
    operator_delete(local_16a8.super_execution_context.service_registry_,0x40);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  using namespace mini_bus;
  using namespace std::chrono_literals;
  try {
    io_service service;
    auto info =
        std::make_shared<BasicConnectionInfo>(service, ip::tcp::endpoint{ip::address::from_string("127.0.0.1"), 4040});
    MiniBusClient client{info};
    info->wait();
    std::cout << "connected" << std::endl;

    client.observe("shared", "key", [](auto sv) {
      if (sv) std::cout << "update: " << *sv << std::endl;
    });

    client.ping(std::string(1024, 'a'))->wait();
    client.set("shared", "key", "value")->wait();
    std::cout << "v: " << *client.get("shared", "key")->wait() << std::endl;

    std::cout << "here" << std::endl;

    for (auto &[k, v] : client.keys("shared")->wait()) { std::cout << "kv: " << v << (int) k << std::endl; }

    client.listen("demo", "event", [](auto data) {
      if (data) std::cout << "event: " << *data << std::endl;
    });

    NotifyToken<int> tok;

    try {
      client.get("registry", "demo")->wait();
    } catch (...) {
      std::cout << "waiting" << std::endl;
      NotifyToken<int> tok;
      client.observe("registry", "demo", [&](auto sv) { tok.notify(0); });
      tok.wait();
    }

    std::cout << "call" << *client.call("demo", "echo", "boom")->wait() << std::endl;

    std::this_thread::sleep_for(10s);
  } catch (std::exception &e) { std::cout << e.what() << std::endl; }
}